

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nhdp_3.c
# Opt level: O1

void addAddresses(rfc5444_writer *wr)

{
  int iVar1;
  undefined8 uVar2;
  char value1;
  char value0;
  netaddr ip;
  undefined1 local_44;
  undefined1 local_43;
  undefined1 local_42 [18];
  
  local_43 = 0;
  local_44 = 1;
  iVar1 = netaddr_from_string(local_42,"fc00:1::1");
  cunit_named_check(iVar1 == 0,"addAddresses",0x6e,"failed to initialize ip");
  uVar2 = rfc5444_writer_add_address(wr,cpr.creator,local_42,0);
  rfc5444_writer_add_addrtlv(wr,uVar2,0x104378,&local_44,1,0);
  iVar1 = netaddr_from_string(local_42,"fc00:2::1");
  cunit_named_check(iVar1 == 0,"addAddresses",0x72,"failed to initialize ip");
  uVar2 = rfc5444_writer_add_address(wr,cpr.creator,local_42,0);
  rfc5444_writer_add_addrtlv(wr,uVar2,addrtlvs,&local_43,1,0);
  iVar1 = netaddr_from_string(local_42,"fc00:3::1");
  cunit_named_check(iVar1 == 0,"addAddresses",0x76,"failed to initialize ip");
  uVar2 = rfc5444_writer_add_address(wr,cpr.creator,local_42,0);
  rfc5444_writer_add_addrtlv(wr,uVar2,0x104378,&local_44,1,0);
  iVar1 = netaddr_from_string(local_42,"fc00:4::1");
  cunit_named_check(iVar1 == 0,"addAddresses",0x7a,"failed to initialize ip");
  uVar2 = rfc5444_writer_add_address(wr,cpr.creator,local_42,0);
  rfc5444_writer_add_addrtlv(wr,uVar2,addrtlvs,&local_43,1,0);
  iVar1 = netaddr_from_string(local_42,"fe80::1234:5678:9abc:def0");
  cunit_named_check(iVar1 == 0,"addAddresses",0x7e,"failed to initialize ip");
  uVar2 = rfc5444_writer_add_address(wr,cpr.creator,local_42,0);
  rfc5444_writer_add_addrtlv(wr,uVar2,0x104378,&local_44,1,0);
  return;
}

Assistant:

static void addAddresses(struct rfc5444_writer *wr) {
  struct netaddr ip;
  struct rfc5444_writer_address *addr;
  char value0 =  0, value1 = 1;

  CHECK_TRUE(0 == netaddr_from_string(&ip, "fc00:1::1"), "failed to initialize ip");
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "fc00:2::1"), "failed to initialize ip");
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[0], &value0, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "fc00:3::1"), "failed to initialize ip");
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "fc00:4::1"), "failed to initialize ip");
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[0], &value0, 1, false);

  CHECK_TRUE(0 == netaddr_from_string(&ip, "fe80::1234:5678:9abc:def0"), "failed to initialize ip");
  addr = rfc5444_writer_add_address(wr, cpr.creator, &ip, false);
  rfc5444_writer_add_addrtlv(wr, addr, &addrtlvs[1], &value1, 1, false);

}